

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O1

void * __kmp_task_reduction_modifier_init<kmp_taskred_input>
                 (ident_t *loc,int gtid,int is_ws,int num,kmp_taskred_input *data)

{
  long *plVar1;
  int iVar2;
  kmp_info_t *thr;
  kmp_team_p *pkVar3;
  undefined1 *reduce_data;
  void *pvVar4;
  void *__dest;
  kmp_taskgroup_t *tg;
  long lVar5;
  bool bVar6;
  
  thr = __kmp_threads[gtid];
  iVar2 = (thr->th).th_team_nproc;
  __kmpc_taskgroup(loc,gtid);
  if (iVar2 == 1) {
    tg = ((thr->th).th_current_task)->td_taskgroup;
  }
  else {
    pkVar3 = (thr->th).th_team;
    lVar5 = (long)is_ws;
    if (*(long *)((long)pkVar3 + lVar5 * 8 + 0x148) == 0) {
      plVar1 = (long *)((long)pkVar3 + lVar5 * 8 + 0x148);
      LOCK();
      bVar6 = *plVar1 == 0;
      if (bVar6) {
        *plVar1 = 1;
      }
      UNLOCK();
      if (bVar6) {
        pvVar4 = __kmp_task_reduction_init<kmp_taskred_input>(gtid,num,data);
        __dest = ___kmp_thread_malloc(thr,(long)num * 0x48);
        memcpy(__dest,*(void **)((long)pvVar4 + 0x10),(long)num * 0x48);
        *(void **)((long)pkVar3 + lVar5 * 8 + 0x148) = __dest;
        return pvVar4;
      }
    }
    do {
      reduce_data = *(undefined1 **)((long)pkVar3 + lVar5 * 8 + 0x148);
    } while (reduce_data == &DAT_00000001);
    tg = ((thr->th).th_current_task)->td_taskgroup;
    __kmp_task_reduction_init_copy<kmp_taskred_input>(thr,num,data,tg,reduce_data);
  }
  return tg;
}

Assistant:

void *__kmp_task_reduction_modifier_init(ident_t *loc, int gtid, int is_ws,
                                         int num, T *data) {
  kmp_info_t *thr = __kmp_threads[gtid];
  kmp_int32 nth = thr->th.th_team_nproc;
  __kmpc_taskgroup(loc, gtid); // form new taskgroup first
  if (nth == 1) {
    KA_TRACE(10,
             ("__kmpc_reduction_modifier_init: T#%d, tg %p, exiting nth=1\n",
              gtid, thr->th.th_current_task->td_taskgroup));
    return (void *)thr->th.th_current_task->td_taskgroup;
  }
  kmp_team_t *team = thr->th.th_team;
  void *reduce_data;
  kmp_taskgroup_t *tg;
  reduce_data = KMP_ATOMIC_LD_RLX(&team->t.t_tg_reduce_data[is_ws]);
  if (reduce_data == NULL &&
      __kmp_atomic_compare_store(&team->t.t_tg_reduce_data[is_ws], reduce_data,
                                 (void *)1)) {
    // single thread enters this block to initialize common reduction data
    KMP_DEBUG_ASSERT(reduce_data == NULL);
    // first initialize own data, then make a copy other threads can use
    tg = (kmp_taskgroup_t *)__kmp_task_reduction_init<T>(gtid, num, data);
    reduce_data = __kmp_thread_malloc(thr, num * sizeof(kmp_taskred_data_t));
    KMP_MEMCPY(reduce_data, tg->reduce_data, num * sizeof(kmp_taskred_data_t));
    // fini counters should be 0 at this point
    KMP_DEBUG_ASSERT(KMP_ATOMIC_LD_RLX(&team->t.t_tg_fini_counter[0]) == 0);
    KMP_DEBUG_ASSERT(KMP_ATOMIC_LD_RLX(&team->t.t_tg_fini_counter[1]) == 0);
    KMP_ATOMIC_ST_REL(&team->t.t_tg_reduce_data[is_ws], reduce_data);
  } else {
    while (
        (reduce_data = KMP_ATOMIC_LD_ACQ(&team->t.t_tg_reduce_data[is_ws])) ==
        (void *)1) { // wait for task reduction initialization
      KMP_CPU_PAUSE();
    }
    KMP_DEBUG_ASSERT(reduce_data > (void *)1); // should be valid pointer here
    tg = thr->th.th_current_task->td_taskgroup;
    __kmp_task_reduction_init_copy<T>(thr, num, data, tg, reduce_data);
  }
  return tg;
}